

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

void __thiscall Js::AsmJsFunc::ReleaseLocationGeneric(AsmJsFunc *this,EmitExpressionInfo *pnode)

{
  bool bVar1;
  EmitExpressionInfo *pnode_local;
  AsmJsFunc *this_local;
  
  if (pnode != (EmitExpressionInfo *)0x0) {
    bVar1 = AsmJsType::isIntish(&pnode->type);
    if (bVar1) {
      ReleaseLocation<int>(this,pnode);
    }
    else {
      bVar1 = AsmJsType::isMaybeDouble(&pnode->type);
      if (bVar1) {
        ReleaseLocation<double>(this,pnode);
      }
      else {
        bVar1 = AsmJsType::isFloatish(&pnode->type);
        if (bVar1) {
          ReleaseLocation<float>(this,pnode);
        }
      }
    }
  }
  return;
}

Assistant:

void AsmJsFunc::ReleaseLocationGeneric(const EmitExpressionInfo* pnode)
    {
        if (pnode)
        {
            if (pnode->type.isIntish())
            {
                ReleaseLocation<int>(pnode);
            }
            else if (pnode->type.isMaybeDouble())
            {
                ReleaseLocation<double>(pnode);
            }
            else if (pnode->type.isFloatish())
            {
                ReleaseLocation<float>(pnode);
            }
        }
    }